

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

int __thiscall pstore::file::file_handle::open(file_handle *this,char *__file,int __oflag,...)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong uVar5;
  _Alloc_hider _Var6;
  string path;
  small_vector<char,_256UL> buffer;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  small_vector<char,_256UL> local_158;
  
  close(this,(int)__file);
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"pst-XXXXXX","");
  pcVar2 = local_158.small_buffer_._M_elems + 8;
  local_158.elements_ = (size_t)pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,local_1c8,local_1c0 + (long)local_1c8);
  local_168._M_len = 1;
  local_168._M_array = (iterator)&local_158;
  pstore::path::posix::join(&local_1a8,(string *)__file,&local_168);
  if ((char *)local_158.elements_ != pcVar2) {
    operator_delete((void *)local_158.elements_,local_158.small_buffer_._M_elems._8_8_ + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  small_vector<char,_256UL>::small_vector(&local_158,local_1a8._M_string_length + 1);
  pcVar2 = local_158.buffer_;
  if (0 < (long)local_1a8._M_string_length) {
    uVar5 = local_1a8._M_string_length + 1;
    _Var6._M_p = local_1a8._M_dataplus._M_p;
    do {
      *pcVar2 = *_Var6._M_p;
      _Var6._M_p = _Var6._M_p + 1;
      pcVar2 = pcVar2 + 1;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  *pcVar2 = '\0';
  iVar1 = mkstemp(local_158.buffer_);
  this->file_ = iVar1;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  pcVar2 = (char *)(this->path_)._M_string_length;
  strlen(local_158.buffer_);
  std::__cxx11::string::_M_replace((ulong)&this->path_,0,pcVar2,(ulong)local_158.buffer_);
  this->is_writable_ = true;
  if (this->file_ != -1) {
    if (local_158.big_buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.big_buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.big_buffer_.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.big_buffer_.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    paVar4 = &local_1a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar4) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      paVar4 = extraout_RAX;
    }
    return (int)paVar4;
  }
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,*(long *)__file,*(long *)(__file + 8) + *(long *)__file);
  (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
            (iVar1,"Unable to create unique file in directory",&local_188);
}

Assistant:

void file_handle::open (unique const, std::string const & directory) {
            this->close ();

            std::string const path = path::join (directory, "pst-XXXXXX");

            // mkstemp() modifies its input parameter so that on return it contains
            // the actual name of the temporary file that was created.
            small_vector<char> buffer (path.length () + 1);
            auto out = std::copy (std::begin (path), std::end (path), std::begin (buffer));
            *out = '\0';

            file_ = ::mkstemp (buffer.data ());
            int const err = errno;
            path_ = buffer.data ();
            is_writable_ = true;
            if (file_ == -1) {
                raise_file_error (err, "Unable to create unique file in directory", directory);
            }
        }